

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ScriptFunctionType * __thiscall
Js::FunctionProxy::GetCrossSiteUndeferredFunctionType(FunctionProxy *this)

{
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptFunctionType *pSVar5;
  ParseableFunctionInfo *pPVar6;
  
  if ((this->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a94a;
    *puVar4 = 0;
  }
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_0076a94a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pFVar1 = (this->functionInfo).ptr;
  pSVar5 = (ScriptFunctionType *)0x0;
  if (((pFVar1->functionBodyImpl).ptr != (FunctionProxy *)0x0) &&
     ((pFVar1->attributes & DeferredDeserialize) == None)) {
    pPVar6 = GetParseableFunctionInfo(this);
    pSVar5 = (pPVar6->crossSiteUndeferredFunctionType).ptr;
  }
  return pSVar5;
}

Assistant:

ScriptFunctionType * FunctionProxy::GetCrossSiteUndeferredFunctionType() const
    {
        return HasParseableInfo() ? GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType() : nullptr;
    }